

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectcleanuphandler.cpp
# Opt level: O0

int __thiscall QObjectCleanupHandler::remove(QObjectCleanupHandler *this,char *__filename)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  int index;
  char *in_stack_00000128;
  QObject *in_stack_00000130;
  char *in_stack_00000138;
  QObject *in_stack_00000140;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QListSpecialMethodsBase<QObject*>::indexOf<QObject*>
                    ((QListSpecialMethodsBase<QObject_*> *)__filename,(QObject **)this,
                     CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffe0));
  if ((int)qVar2 != -1) {
    QList<QObject_*>::removeAt
              ((QList<QObject_*> *)CONCAT44((int)qVar2,in_stack_ffffffffffffffe0),(qsizetype)this);
    QObject::disconnect(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QObjectCleanupHandler::remove(QObject *object)
{
    int index;
    if ((index = cleanupObjects.indexOf(object)) != -1) {
        cleanupObjects.removeAt(index);
        disconnect(object, SIGNAL(destroyed(QObject*)), this, SLOT(objectDestroyed(QObject*)));
    }
}